

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

ArgSlot __thiscall
Inline::MapActuals(Inline *this,Instr *callInstr,Instr **argOuts,ArgSlot formalCount,Func *inlinee,
                  ProfileId callSiteId,bool *stackArgsArgOutExpanded,Instr **argOutsExtra,
                  ArgSlot maxParamCount)

{
  StackSym *this_00;
  Func *this_01;
  Instr *pIVar1;
  code *pcVar2;
  Inline *pIVar3;
  uint uVar4;
  bool bVar5;
  OpndKind OVar6;
  ArgSlot AVar7;
  int iVar8;
  int32 iVar9;
  uint uVar10;
  undefined4 *puVar11;
  JITTimeFunctionBody *this_02;
  StackSym *sym;
  SymOpnd *dstOpnd;
  undefined4 extraout_var;
  AddrOpnd *this_03;
  Instr *pIVar12;
  IntConstOpnd *pIVar13;
  undefined6 in_register_0000000a;
  Func *pFVar14;
  Opnd *this_04;
  ushort uVar15;
  ushort uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  int local_7c;
  Func *local_78;
  Inline *local_70;
  Instr **local_68;
  Instr *local_60;
  int local_54;
  int local_50;
  uint local_4c;
  ulong local_48;
  undefined4 *local_40;
  ProfileId local_36;
  uint local_34;
  ProfileId callSiteId_local;
  
  local_34 = (uint)CONCAT62(in_register_0000000a,formalCount);
  local_68 = argOuts;
  local_60 = callInstr;
  local_36 = callSiteId;
  if (maxParamCount < formalCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x130d,"(formalCount <= maxParamCount)","formalCount <= maxParamCount");
    if (!bVar5) goto LAB_00550684;
    *puVar11 = 0;
  }
  this_04 = local_60->m_src2;
  *stackArgsArgOutExpanded = false;
  uVar10 = this->currentInlineeFrameSlot;
  if (inlinee != (Func *)0x0) {
    bVar5 = GetInlineeHasArgumentObject(this,inlinee);
    if ((*(uint *)&inlinee->field_0x240 >> 10 & 1) == 0) {
      *(uint *)&inlinee->field_0x240 = *(uint *)&inlinee->field_0x240 | (uint)bVar5 << 10;
    }
    pFVar14 = inlinee->parentFunc;
    if (bVar5 && pFVar14 != (Func *)0x0) {
      do {
        pFVar14->field_0x241 = pFVar14->field_0x241 | 4;
        pFVar14 = pFVar14->parentFunc;
      } while (pFVar14 != (Func *)0x0);
    }
  }
  OVar6 = IR::Opnd::GetKind(this_04);
  if (OVar6 == OpndKindSym) {
    local_48 = 0;
    local_54 = uVar10 + 2;
    local_70 = this;
    local_40 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_50 = (local_34 & 0xffff) - 1;
    uVar18 = 0;
    local_78 = inlinee;
    do {
      pFVar14 = local_78;
      OVar6 = IR::Opnd::GetKind(this_04);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = local_40;
        *local_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1321,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
        if (!bVar5) goto LAB_00550684;
        *puVar11 = 0;
      }
      OVar6 = IR::Opnd::GetKind(this_04);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = local_40;
        *local_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_00550684;
        *puVar11 = 0;
      }
      this_00 = (StackSym *)this_04[1]._vptr_Opnd;
      if ((this_00->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = local_40;
        *local_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_00550684;
        *puVar11 = 0;
      }
      if ((this_00->field_0x18 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = local_40;
        *local_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1324,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar5) goto LAB_00550684;
        *puVar11 = 0;
      }
      if (((this_00->field_0x1a & 0x10) != 0) && (*(short *)&(this_00->super_Sym).field_0x16 == 0))
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = local_40;
        *local_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar5) goto LAB_00550684;
        *puVar11 = 0;
      }
      if ((this_00->field_0x1a & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = local_40;
        *local_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1325,"(sym->IsArgSlotSym())","sym->IsArgSlotSym()");
        if (!bVar5) goto LAB_00550684;
        *puVar11 = 0;
      }
      this_00->field_0x19 = this_00->field_0x19 | 0x40;
      this_01 = local_70->topFunc;
      AVar7 = StackSym::GetArgSlotNum(this_00);
      Func::SetArgOffset(this_01,this_00,((uint)AVar7 + local_54) * 8);
      pIVar1 = (this_00->field_5).m_instrDef;
      if ((pFVar14 != (Func *)0x0) && (pIVar1->m_opcode == ArgOut_A)) {
        if ((pFVar14->field_0x241 & 4) == 0) {
          pIVar1->m_opcode = ArgOut_A_Inline;
        }
        this_02 = JITTimeWorkItem::GetJITFunctionBody(pFVar14->m_workItem);
        bVar5 = JITTimeFunctionBody::IsAsmJsMode(this_02);
        if (!bVar5) {
          IR::Instr::GenerateBytecodeArgOutCapture(pIVar1);
        }
      }
      if (pFVar14 == (Func *)0x0) {
LAB_0054ff79:
        uVar16 = (ushort)local_34;
      }
      else {
        uVar16 = (ushort)local_34;
        if (pIVar1->m_opcode == ArgOut_A_FromStackArgs) {
          iVar17 = local_50;
          local_4c = uVar18;
          if (1 < uVar16) {
            do {
              AVar7 = StackSym::GetArgSlotNum(this_00);
              sym = StackSym::NewArgSlotSym(AVar7,pIVar1->m_func,TyVar);
              sym->field_0x19 = sym->field_0x19 | 0x40;
              dstOpnd = IR::SymOpnd::New(&sym->super_Sym,this_00->m_type,pIVar1->m_func);
              pIVar3 = local_70;
              iVar8 = (*local_70->topFunc->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
              this_03 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar8),AddrOpndKindDynamicVar,
                                          pIVar3->topFunc,true,(Var)0x0);
              IR::Opnd::SetValueType(&this_03->super_Opnd,(ValueType)0x2);
              pIVar12 = IR::Instr::New(ArgOut_A_FixupForStackArgs,&dstOpnd->super_Opnd,
                                       &this_03->super_Opnd,pIVar1->m_src2,pIVar1->m_func);
              IR::Instr::InsertBefore(pIVar1,pIVar12);
              IR::Instr::ReplaceSrc2(pIVar1,pIVar12->m_dst);
              StackSym::IncrementArgSlotNum(this_00);
              pFVar14 = pIVar1->m_func;
              AVar7 = StackSym::GetArgSlotNum(this_00);
              Func::SetArgOffset(pFVar14,this_00,((uint)AVar7 + local_54) * 8);
              IR::Instr::GenerateArgOutSnapshot(pIVar12);
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
            local_48 = (ulong)(uint)((int)local_48 + local_50);
          }
          pIVar13 = IR::IntConstOpnd::New((ulong)local_36,TyUint16,pIVar1->m_func,false);
          IR::Instr::ReplaceSrc1(pIVar1,&pIVar13->super_Opnd);
          uVar18 = local_4c - 1;
          *stackArgsArgOutExpanded = true;
          goto LAB_0054ff79;
        }
      }
      AVar7 = StackSym::GetArgSlotNum(this_00);
      uVar15 = AVar7 - 1;
      if (uVar15 < uVar16) {
        pIVar12 = pIVar1;
        if (0xe < uVar15) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = local_40;
          *local_40 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x1368,"(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                             "currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount");
          if (!bVar5) goto LAB_00550684;
          *puVar11 = 0;
        }
LAB_0054ffe8:
        local_68[uVar15] = pIVar12;
      }
      else if (pIVar1->m_opcode != ArgOut_A_FromStackArgs) {
        if (0xf < uVar15) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = local_40;
          *local_40 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x136f,"(currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount)"
                             ,"currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount");
          if (!bVar5) goto LAB_00550684;
          *puVar11 = 0;
        }
        if ((argOutsExtra != (Instr **)0x0) &&
           (argOutsExtra[uVar15] = pIVar1, uVar15 < maxParamCount)) {
          pIVar12 = (Instr *)0x0;
          goto LAB_0054ffe8;
        }
      }
      uVar18 = uVar18 + 1;
      this_04 = pIVar1->m_src2;
      OVar6 = IR::Opnd::GetKind(this_04);
      uVar4 = local_34;
    } while (OVar6 == OpndKindSym);
    uVar16 = (ushort)uVar18;
    if (0xf < uVar16) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x137e,"(actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                         "actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount");
      if (!bVar5) goto LAB_00550684;
      *puVar11 = 0;
    }
    uVar15 = (ushort)uVar4;
    if (uVar16 < (ushort)uVar4) {
      uVar15 = uVar16;
    }
    local_4c = uVar18;
    if (uVar15 != 0) {
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar19 = 0;
      do {
        if (local_68[uVar19] == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x1382,"(argOuts[i])","argOuts[i]");
          if (!bVar5) goto LAB_00550684;
          *puVar11 = 0;
        }
        uVar19 = uVar19 + 1;
      } while (uVar15 != uVar19);
    }
    local_48 = (ulong)((int)local_48 - 1);
    uVar18 = local_4c;
  }
  else {
    local_48 = 0xffffffff;
    uVar18 = 0;
  }
  uVar4 = local_34;
  AVar7 = (ArgSlot)uVar18;
  OVar6 = IR::Opnd::GetKind(this_04);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,4999,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
    if (!bVar5) goto LAB_00550684;
    *puVar11 = 0;
  }
  OVar6 = IR::Opnd::GetKind(this_04);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_00550684;
    *puVar11 = 0;
  }
  if (((ulong)this_04[1]._vptr_Opnd[3] & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,5000,"(linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef)",
                       "linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef");
    if (!bVar5) goto LAB_00550684;
    *puVar11 = 0;
  }
  OVar6 = IR::Opnd::GetKind(this_04);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_00550684;
    *puVar11 = 0;
  }
  if (*(short *)(this_04[1]._vptr_Opnd[5] + 0x30) != 7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x138a,"(startCallOpCode == Js::OpCode::StartCall)",
                       "startCallOpCode == Js::OpCode::StartCall");
    if (!bVar5) goto LAB_00550684;
    *puVar11 = 0;
  }
  if (*stackArgsArgOutExpanded == true) {
    OVar6 = IR::Opnd::GetKind(this_04);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_00550684;
      *puVar11 = 0;
    }
    pIVar13 = *(IntConstOpnd **)(this_04[1]._vptr_Opnd[5] + 0x48);
    OVar6 = IR::Opnd::GetKind(&pIVar13->super_Opnd);
    if (OVar6 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar5) goto LAB_00550684;
      *puVar11 = 0;
    }
    iVar9 = IR::IntConstOpnd::AsInt32(pIVar13);
    IR::IntConstOpnd::SetValue(pIVar13,(long)(iVar9 + (int)local_48));
    pIVar1 = local_60;
    Func::EnsureCallSiteToArgumentsOffsetFixupMap(local_60->m_func);
    bVar5 = JsUtil::
            BaseDictionary<unsigned_short,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(pIVar1->m_func->callSiteToArgumentsOffsetFixupMap,&local_36);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x139a,
                         "(!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId)))"
                         ,
                         "!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId))"
                        );
      if (!bVar5) goto LAB_00550684;
      *puVar11 = 0;
    }
    local_7c = (int)local_48;
    JsUtil::
    BaseDictionary<unsigned_short,int,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_short,int,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_short,int,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)local_60->m_func->callSiteToArgumentsOffsetFixupMap,&local_36,&local_7c);
  }
  OVar6 = IR::Opnd::GetKind(this_04);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_00550684;
    *puVar11 = 0;
  }
  uVar10 = IR::Instr::GetArgOutCount((Instr *)this_04[1]._vptr_Opnd[5],false);
  if (uVar10 != (uVar18 & 0xffff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x139e,
                       "(linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount( false) == actualCount)"
                       ,
                       "linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount( false) == actualCount"
                      );
    if (!bVar5) goto LAB_00550684;
    *puVar11 = 0;
  }
  OVar6 = IR::Opnd::GetKind(this_04);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) {
LAB_00550684:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar11 = 0;
  }
  *(uint *)(this_04[1]._vptr_Opnd + 3) = *(uint *)(this_04[1]._vptr_Opnd + 3) | 0x4000;
  if (AVar7 < (ushort)uVar4) {
    memset(local_68 + (uVar18 & 0xffff),0,(ulong)(uVar4 + ~uVar18 & 0xffff) * 8 + 8);
  }
  if (*stackArgsArgOutExpanded == true) {
    AVar7 = local_60->m_func->actualCount;
  }
  return AVar7;
}

Assistant:

Js::ArgSlot
Inline::MapActuals(IR::Instr *callInstr, __out_ecount(maxParamCount) IR::Instr *argOuts[],
    Js::ArgSlot formalCount,
    Func* inlinee,
    Js::ProfileId callSiteId,
    bool *stackArgsArgOutExpanded,
    IR::Instr *argOutsExtra[],
    Js::ArgSlot maxParamCount /* = Js::InlineeCallInfo::MaxInlineeArgoutCount*/)
{
    AnalysisAssert(formalCount <= maxParamCount);

    IR::Opnd *linkOpnd = callInstr->GetSrc2();
    Js::ArgSlot actualCount = 0;

    *stackArgsArgOutExpanded = false;
    uint inlineeFrameSlot = currentInlineeFrameSlot + (Js::Constants::InlineeMetaArgCount - 1);
    uint fixupArgoutCount = 0;

    if (inlinee)
    {
        bool hasArgumentsAccess = this->GetInlineeHasArgumentObject(inlinee);
        inlinee->SetHasUnoptimizedArgumentsAccess(hasArgumentsAccess);
    }

    if (linkOpnd->IsSymOpnd())
    {
        IR::Instr *argInstr;
        do
        {
            Assert(linkOpnd->IsSymOpnd());
            StackSym *sym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();

            Assert(sym->m_isSingleDef);
            Assert(sym->IsArgSlotSym());
            sym->m_isInlinedArgSlot = true;
            this->topFunc->SetArgOffset(sym, (inlineeFrameSlot + sym->GetArgSlotNum()) * MachPtr);
            argInstr = sym->m_instrDef;
            if (argInstr->m_opcode == Js::OpCode::ArgOut_A)
            {
                if(inlinee)
                {
                    if (!inlinee->GetHasUnoptimizedArgumentsAccess())
                    {
                        // This allows us to markTemp the argOut source.
                        argInstr->m_opcode = Js::OpCode::ArgOut_A_Inline;
                    }
                    if (!inlinee->GetJITFunctionBody()->IsAsmJsMode())
                    {
                        argInstr->GenerateBytecodeArgOutCapture();
                    }
                }
            }

            // Expand
            //
            // s31 ArgOut_A s32
            // s30 ArgOut_A_FromStackArgs s31
            //
            // to
            //
            // s31 ArgOut_A(_Inline) s32
            // sXX ArgOut_A_FixupForStackArgs s31
            // .
            // .
            // s34 ArgOut_A_FixupForStackArgs sXX
            // s30 ArgOut_A_FromStackArgs s34

            if (inlinee && argInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs)
            {
                IR::Instr * argFixupInstr;
                for(uint currentFormal = 1; currentFormal < formalCount; currentFormal++)
                {
                    StackSym* newStackSym = StackSym::NewArgSlotSym(sym->GetArgSlotNum(), argInstr->m_func);
                    newStackSym->m_isInlinedArgSlot = true;

                    IR::SymOpnd * newLinkOpnd = IR::SymOpnd::New(newStackSym, sym->GetType(), argInstr->m_func);
                    IR::Opnd * undefined = IR::AddrOpnd::New(this->topFunc->GetScriptContextInfo()->GetUndefinedAddr(),
                                                IR::AddrOpndKindDynamicVar, this->topFunc, true);
                    undefined->SetValueType(ValueType::Undefined);

                    argFixupInstr = IR::Instr::New(Js::OpCode::ArgOut_A_FixupForStackArgs, newLinkOpnd, undefined, argInstr->GetSrc2(), argInstr->m_func);
                    argInstr->InsertBefore(argFixupInstr);
                    argInstr->ReplaceSrc2(argFixupInstr->GetDst());
                    sym->IncrementArgSlotNum();
                    argInstr->m_func->SetArgOffset(sym, (inlineeFrameSlot + sym->GetArgSlotNum()) * MachPtr);

                    argFixupInstr->GenerateArgOutSnapshot();
                    fixupArgoutCount++;
                }
                // Now that the arguments object has been expanded, we don't require the sym corresponding to it.
                IR::IntConstOpnd* callSiteIdOpnd = IR::IntConstOpnd::New(callSiteId, TyUint16, argInstr->m_func);
                argInstr->ReplaceSrc1(callSiteIdOpnd);
                // Don't count ArgOut_A_FromStackArgs as an actual, when it has been expanded
                --actualCount;
                *stackArgsArgOutExpanded = true;
            }
            ++actualCount;
            const Js::ArgSlot currentActual = sym->GetArgSlotNum() - 1;
            if (currentActual < formalCount)
            {
                Assert(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount);
                argOuts[currentActual] = argInstr;
            }

            // We don't want to treat ArgOut_A_FromStackArgs as an actual arg.
            else if (argInstr->m_opcode != Js::OpCode::ArgOut_A_FromStackArgs)
            {
                Assert(currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount);
                if(argOutsExtra)
                {
                    argOutsExtra[currentActual] = argInstr;
                    if (currentActual < maxParamCount)
                    {
                        __analysis_assume(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount);
                        argOuts[currentActual] = nullptr;
                    }
                }
            }
            linkOpnd = argInstr->GetSrc2();
        }
        while (linkOpnd->IsSymOpnd());
#if DBG
        Assert(actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount);
        for(Js::ArgSlot i = 0; i < min(actualCount, formalCount); ++i)
        {
#pragma prefast(suppress:6001)
            Assert(argOuts[i]);
        }
#endif
    }

    Assert(linkOpnd->IsRegOpnd());
    Assert(linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef);
    Js::OpCode startCallOpCode = linkOpnd->AsRegOpnd()->m_sym->m_instrDef->m_opcode;
    Assert(startCallOpCode == Js::OpCode::StartCall);

    // Update the count in StartCall to reflect
    //  1. ArgOut_A_FromStackArgs is not an actual once it has been expanded.
    //  2. The expanded argouts (from ArgOut_A_FromStackArgs).
    //
    // Note that the StartCall will reflect the formal count only as of now; the actual count would be set during MapFormals
    if(*stackArgsArgOutExpanded)
    {
        // TODO: Is an underflow here intended, it triggers on test\inlining\OS_2733280.js
        IR::IntConstOpnd * countOpnd = linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetSrc1()->AsIntConstOpnd();
        int32 count = countOpnd->AsInt32();
        count += fixupArgoutCount - 1;
        countOpnd->SetValue(count);

        callInstr->m_func->EnsureCallSiteToArgumentsOffsetFixupMap();
        Assert(!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId)));
        callInstr->m_func->callSiteToArgumentsOffsetFixupMap->Add(callSiteId, fixupArgoutCount - 1);
    }

    Assert(linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ false) == actualCount);

    // Mark the StartCall's dst as an inlined arg slot as well so we know this is an inlined start call
    // and not adjust the stack height on x86
    linkOpnd->AsRegOpnd()->m_sym->m_isInlinedArgSlot = true;

    // Missing arguments...
    for (Js::ArgSlot i = actualCount; i < formalCount; i++)
    {
        argOuts[i] = nullptr;
    }

    // We may not know the exact number of actuals that "b" gets in a.b.apply just yet, since we have expanded the ArgOut_A_FromStackArgs based on the number of formals "b" accepts.
    // So, return the actualCount stored on the func if the ArgOut_A_FromStackArgs was expanded (and thus, the expanded argouts were accounted for in calculating the local actualCount)
    return *stackArgsArgOutExpanded ? callInstr->m_func->actualCount : actualCount;
}